

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O3

int run_test_tcp_close_reset_accepted_after_shutdown(void)

{
  uv_loop_t *puVar1;
  int iVar2;
  int iVar3;
  undefined8 *extraout_RDX;
  uv_loop_t *unaff_RBX;
  uv_tcp_t *in_RSI;
  uv_tcp_t *handle;
  long *plVar4;
  int64_t eval_b;
  int64_t eval_a;
  long lStack_30;
  long lStack_28;
  uv_loop_t *puStack_20;
  uv_loop_t *local_18;
  uv_loop_t *local_10;
  
  handle = (uv_tcp_t *)&stack0xffffffffffffffe8;
  puStack_20 = (uv_loop_t *)0x1c969a;
  loop = (uv_loop_t *)uv_default_loop();
  puStack_20 = (uv_loop_t *)0x1c96a9;
  start_server(loop,in_RSI);
  client_close = 0;
  shutdown_before_close = 1;
  puStack_20 = (uv_loop_t *)0x1c96c6;
  do_connect(loop,in_RSI);
  local_10 = (uv_loop_t *)(long)write_cb_called;
  local_18 = (uv_loop_t *)0x0;
  if (local_10 == (uv_loop_t *)0x0) {
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c9826;
    local_10 = (uv_loop_t *)(long)shutdown_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c9833;
    puStack_20 = (uv_loop_t *)0x1c973d;
    iVar2 = uv_run(loop,0);
    puVar1 = loop;
    local_10 = (uv_loop_t *)(long)iVar2;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c9840;
    local_10 = (uv_loop_t *)0x4;
    local_18 = (uv_loop_t *)(long)write_cb_called;
    if (local_18 != (uv_loop_t *)0x4) goto LAB_001c984d;
    local_10 = (uv_loop_t *)(long)close_cb_called;
    local_18 = (uv_loop_t *)0x0;
    if (local_10 != (uv_loop_t *)0x0) goto LAB_001c985a;
    local_10 = (uv_loop_t *)0x1;
    local_18 = (uv_loop_t *)(long)shutdown_cb_called;
    if (local_18 != (uv_loop_t *)0x1) goto LAB_001c9867;
    puStack_20 = (uv_loop_t *)0x1c97dc;
    uv_walk(loop,close_walk_cb,0);
    puStack_20 = (uv_loop_t *)0x1c97e6;
    uv_run(puVar1,0);
    local_10 = (uv_loop_t *)0x0;
    puStack_20 = (uv_loop_t *)0x1c97fb;
    iVar2 = uv_loop_close(loop);
    local_18 = (uv_loop_t *)(long)iVar2;
    unaff_RBX = puVar1;
    if (local_10 == local_18) {
      puStack_20 = (uv_loop_t *)0x1c9811;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_20 = (uv_loop_t *)0x1c9826;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_1();
LAB_001c9826:
    puStack_20 = (uv_loop_t *)0x1c9833;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_2();
LAB_001c9833:
    puStack_20 = (uv_loop_t *)0x1c9840;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_3();
LAB_001c9840:
    puStack_20 = (uv_loop_t *)0x1c984d;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_4();
LAB_001c984d:
    puStack_20 = (uv_loop_t *)0x1c985a;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_5();
LAB_001c985a:
    puStack_20 = (uv_loop_t *)0x1c9867;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_6();
LAB_001c9867:
    puStack_20 = (uv_loop_t *)0x1c9874;
    run_test_tcp_close_reset_accepted_after_shutdown_cold_7();
  }
  puStack_20 = (uv_loop_t *)run_test_tcp_close_reset_accepted_after_socket_shutdown;
  run_test_tcp_close_reset_accepted_after_shutdown_cold_8();
  iVar2 = (int)&lStack_30;
  puStack_20 = unaff_RBX;
  loop = (uv_loop_t *)uv_default_loop();
  start_server(loop,handle);
  client_close = 0;
  shutdown_before_close = 2;
  do_connect(loop,handle);
  lStack_28 = (long)write_cb_called;
  lStack_30 = 0;
  if (lStack_28 == 0) {
    lStack_28 = (long)close_cb_called;
    lStack_30 = 0;
    if (lStack_28 != 0) goto LAB_001c9a17;
    lStack_28 = (long)shutdown_cb_called;
    lStack_30 = 0;
    if (lStack_28 != 0) goto LAB_001c9a24;
    iVar3 = uv_run(loop,0);
    puVar1 = loop;
    lStack_28 = (long)iVar3;
    lStack_30 = 0;
    if (lStack_28 != 0) goto LAB_001c9a31;
    lStack_28 = 4;
    lStack_30 = (long)write_cb_called;
    if (lStack_30 != 4) goto LAB_001c9a3e;
    lStack_28 = 1;
    lStack_30 = (long)close_cb_called;
    if (lStack_30 != 1) goto LAB_001c9a4b;
    lStack_28 = (long)shutdown_cb_called;
    lStack_30 = 0;
    if (lStack_28 != 0) goto LAB_001c9a58;
    uv_walk(loop,close_walk_cb,0);
    uv_run(puVar1,0);
    lStack_28 = 0;
    iVar3 = uv_loop_close(loop);
    lStack_30 = (long)iVar3;
    if (lStack_28 == lStack_30) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_1();
LAB_001c9a17:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_2();
LAB_001c9a24:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_3();
LAB_001c9a31:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_4();
LAB_001c9a3e:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_5();
LAB_001c9a4b:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_6();
LAB_001c9a58:
    run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_7();
  }
  plVar4 = &lStack_28;
  run_test_tcp_close_reset_accepted_after_socket_shutdown_cold_8();
  if (iVar2 == 0) {
    iVar2 = uv_tcp_init(loop,&tcp_accepted);
    if (iVar2 == 0) {
      iVar2 = uv_accept(plVar4,&tcp_accepted);
      if (iVar2 == 0) {
        iVar2 = uv_read_start(&tcp_accepted,alloc_cb,read_cb);
        return iVar2;
      }
      goto LAB_001c9b24;
    }
  }
  else {
    connection_cb_cold_1();
  }
  connection_cb_cold_2();
LAB_001c9b24:
  connection_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x400;
  return 0x37e460;
}

Assistant:

TEST_IMPL(tcp_close_reset_accepted_after_shutdown) {
  int r;

  loop = uv_default_loop();

  start_server(loop, &tcp_server);

  client_close = 0;
  shutdown_before_close = 1;

  do_connect(loop, &tcp_client);

  ASSERT_OK(write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_OK(shutdown_cb_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(4, write_cb_called);
  ASSERT_OK(close_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}